

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiDir ImGetDirQuadrantFromDelta(float dx,float dy)

{
  uint uVar1;
  
  uVar1 = (uint)(0.0 < dx);
  if (ABS(dx) <= ABS(dy)) {
    uVar1 = 0.0 < dy | 2;
  }
  return uVar1;
}

Assistant:

static inline float  ImFabs(float x)                                            { return fabsf(x); }